

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplaceRealloc<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,pointer pos,DistItem *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pDVar4;
  long lVar5;
  pointer pDVar6;
  pointer pDVar7;
  iterator __result;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::ast::DistExpression::DistItem> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  DistItem *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::ast::DistExpression::DistItem> *)0x9a67ab);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pDVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pDVar4;
  pDVar6 = (pointer)operator_new(0x9a680a);
  pDVar7 = pDVar6 + (lVar5 >> 5);
  pDVar7->value = (Expression *)*in_RDX;
  *(undefined8 *)
   &(pDVar7->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
       in_RDX[1];
  (pDVar7->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
  _M_value.expr = (Expression *)in_RDX[2];
  *(undefined8 *)
   &(pDVar7->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
       in_RDX[3];
  pDVar4 = end(in_RDI);
  if (in_RSI == pDVar4) {
    __result = begin(in_RDI);
    pDVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::DistExpression::DistItem*,slang::ast::DistExpression::DistItem*>
              (in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::ast::DistExpression::DistItem*,slang::ast::DistExpression::DistItem*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pDVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::DistExpression::DistItem*,slang::ast::DistExpression::DistItem*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pDVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pDVar6;
  return pDVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}